

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O1

ArgString * __thiscall
Potassco::ArgString::get<Potassco::Set<Clasp::HeuParams::DomPref>>
          (ArgString *this,Set<Clasp::HeuParams::DomPref> *x)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  KV *pKVar5;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  bool bVar9;
  uint n;
  char *next;
  Set<Clasp::HeuParams::DomPref> local_5c;
  char *local_58;
  Set<Clasp::HeuParams::DomPref> *local_50;
  ArgString *local_48;
  Span<Potassco::KV> local_40;
  
  pcVar7 = this->in;
  if (pcVar7 != (char *)0x0) {
    cVar1 = *pcVar7;
    cVar2 = this->skip;
    uVar8 = 0;
    iVar4 = Potassco::xconvert(pcVar7 + (cVar1 == cVar2),&local_5c.val,&local_58,0);
    if (iVar4 == 0) {
      local_58 = "";
      local_5c.val = 0;
      pcVar7 = pcVar7 + (cVar1 == cVar2);
      local_50 = x;
      local_48 = this;
      while( true ) {
        local_40.first = (KV *)&Clasp::enumMap(Clasp::HeuParams::DomPref_const*)::map;
        local_40.size = 6;
        pKVar5 = findValue(&local_40,pcVar7 + (*local_58 == ','),&local_58,",");
        this = local_48;
        x = local_50;
        if (pKVar5 == (KV *)0x0) break;
        local_5c.val = local_5c.val | pKVar5->value;
        uVar8 = uVar8 + 1;
        pcVar7 = local_58;
      }
    }
    else {
      lVar6 = 8;
      uVar8 = 0;
      do {
        uVar3 = *(uint *)((long)&Clasp::enumMap(Clasp::HeuParams::DomPref_const*)::map + lVar6);
        uVar8 = uVar3 | uVar8;
        bVar9 = (local_5c.val & ~uVar8) == 0;
        if (lVar6 == 0x58) break;
        lVar6 = lVar6 + 0x10;
      } while ((!bVar9 || local_5c.val == 0) && local_5c.val != uVar3);
      uVar8 = (uint)(bVar9 && local_5c.val != 0 || local_5c.val == uVar3);
    }
    if (uVar8 == 0) {
      local_58 = (char *)0x0;
    }
    else {
      x->val = local_5c.val;
    }
    this->in = local_58;
    this->skip = ',';
  }
  return this;
}

Assistant:

ArgString& get(T& x)  {
		if (ok()) {
			const char* next = in + (*in == skip);
			in = xconvert(next, x, &next, 0) != 0 ? next : 0;
			skip = ',';
		}
		return *this;
	}